

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)64>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedTypeCases)

{
  TestCaseGroup *pTVar1;
  LayoutQualifier *pLVar2;
  TestCaseGroup *blockGroup_3;
  undefined1 local_88 [8];
  SharedPtr matrixOrder_1;
  TestCaseGroup *blockGroup_2;
  undefined1 local_58 [8];
  SharedPtr matrixOrder;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  bool extendedTypeCases_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  if (extendedTypeCases) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar1,context,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    generateBufferVariableMatrixVariableBasicTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR)
    ;
  }
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"no_qualifier","No qualifier");
  matrixOrder.m_state = (SharedPtrStateBase *)pTVar1;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,parentStructure,(TestCaseGroup *)matrixOrder.m_state,
             PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);
  pLVar2 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout((Layout *)((long)&blockGroup_2 + 4),-1,-1,-1,FORMATLAYOUT_LAST,
                      MATRIXORDER_COLUMN_MAJOR);
  ResourceDefinition::LayoutQualifier::LayoutQualifier
            (pLVar2,parentStructure,(Layout *)((long)&blockGroup_2 + 4));
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_58,(Node *)pLVar2);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"column_major","Column major qualifier");
  matrixOrder_1.m_state = (SharedPtrStateBase *)pTVar1;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,(SharedPtr *)local_58,(TestCaseGroup *)matrixOrder_1.m_state,
             PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_58);
  pLVar2 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout((Layout *)((long)&blockGroup_3 + 4),-1,-1,-1,FORMATLAYOUT_LAST,
                      MATRIXORDER_ROW_MAJOR);
  ResourceDefinition::LayoutQualifier::LayoutQualifier
            (pLVar2,parentStructure,(Layout *)((long)&blockGroup_3 + 4));
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_88,(Node *)pLVar2);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"row_major","Row major qualifier");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,(SharedPtr *)local_88,(TestCaseGroup *)pTVar1,
             PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_88);
  return;
}

Assistant:

static void generateBufferVariableMatrixCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool extendedTypeCases)
{
	// .types
	if (extendedTypeCases)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "types", "Types");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableBasicTypeCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .no_qualifier
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "no_qualifier", "No qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .column_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_COLUMN_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "column_major", "Column major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}

	// .row_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_ROW_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "row_major", "Row major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}
}